

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

void __thiscall iDynTree::SensorsList::constructor(SensorsList *this,SensorsList *other)

{
  int iVar1;
  pointer __new_size;
  size_t sVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long> *__x;
  reference this_00;
  reference ppSVar3;
  undefined4 extraout_var;
  Sensor *pSVar4;
  long in_RSI;
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_long>_>::value,_pair<iterator,_bool>_>
  _Var5;
  string sensor_name;
  size_t sens;
  int sens_type;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  in_stack_ffffffffffffff00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *in_stack_ffffffffffffff10;
  SensorsList *in_stack_ffffffffffffff18;
  value_type *in_stack_ffffffffffffff20;
  ulong uVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_78;
  int local_4c;
  ulong local_48;
  int local_40;
  long local_10;
  
  local_10 = in_RSI;
  __new_size = (pointer)operator_new(0x30);
  __new_size[1].super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __new_size[1].super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__new_size->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size[1].super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__new_size->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__new_size->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SensorsListPimpl::SensorsListPimpl((SensorsListPimpl *)in_stack_ffffffffffffff00._M_node);
  (in_RDI->
  super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = __new_size;
  std::allocator<iDynTree::Sensor_*>::allocator((allocator<iDynTree::Sensor_*> *)0x474412);
  std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::vector
            (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18,
             (allocator_type *)in_stack_ffffffffffffff10);
  std::
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ::resize(in_RDI,(size_type)__new_size,in_stack_ffffffffffffff20);
  std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::~vector
            ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)
             in_stack_ffffffffffffff10);
  std::allocator<iDynTree::Sensor_*>::~allocator((allocator<iDynTree::Sensor_*> *)0x47445d);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
  ::resize((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
            *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
  for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
    local_48 = 0;
    while( true ) {
      local_4c = local_40;
      uVar6 = local_48;
      sVar2 = getNrOfSensors((SensorsList *)in_stack_ffffffffffffff00._M_node,
                             (SensorType *)
                             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      if (sVar2 <= uVar6) break;
      __x = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
             *)std::
               vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
               ::operator[]((vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                             *)(in_RDI->
                               super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,(long)local_40);
      this_00 = std::
                vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                ::operator[](*(vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                               **)(local_10 + 8),(long)local_40);
      ppSVar3 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator[]
                          (this_00,local_48);
      iVar1 = (*(*ppSVar3)->_vptr_Sensor[6])();
      local_78.second = CONCAT44(extraout_var,iVar1);
      std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::push_back
                ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)
                 in_stack_ffffffffffffff00._M_node,
                 (value_type *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      pSVar4 = getSensor(in_stack_ffffffffffffff18,(SensorType *)in_stack_ffffffffffffff10,
                         (ptrdiff_t)__x);
      in_stack_ffffffffffffff10 = &local_78;
      (*pSVar4->_vptr_Sensor[2])();
      in_stack_ffffffffffffff18 =
           (SensorsList *)
           std::
           vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
           ::operator[]((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
                         *)((in_RDI->
                            super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + 1),(long)local_40);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long_&,_true>
                (in_stack_ffffffffffffff10,&__x->first,
                 (unsigned_long *)in_stack_ffffffffffffff00._M_node);
      _Var5 = std::
              map<std::__cxx11::string,long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
              ::insert<std::pair<std::__cxx11::string,long>>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                          *)in_stack_ffffffffffffff10,__x);
      in_stack_ffffffffffffff00 = _Var5.first._M_node;
      in_stack_fffffffffffffeff = _Var5.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
             *)0x4745f6);
      std::__cxx11::string::~string((string *)&local_78);
      local_48 = local_48 + 1;
    }
  }
  return;
}

Assistant:

void SensorsList::constructor(const SensorsList& other)
{
    this->pimpl = new SensorsListPimpl();
    this->pimpl->allSensors.resize(NR_OF_SENSOR_TYPES,std::vector<Sensor *>(0));
    this->pimpl->sensorsNameToIndex.resize(NR_OF_SENSOR_TYPES);
    for(int sens_type = 0; sens_type < NR_OF_SENSOR_TYPES; sens_type++ )
    {
        for(std::size_t sens = 0; sens < other.getNrOfSensors((SensorType)sens_type); sens++ )
        {
            this->pimpl->allSensors[sens_type].push_back(other.pimpl->allSensors[sens_type][sens]->clone());
            std::string sensor_name = other.getSensor((SensorType)sens_type,sens)->getName();
            this->pimpl->sensorsNameToIndex[sens_type].insert(std::pair<std::string,std::ptrdiff_t>(sensor_name,sens));
        }
    }
}